

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# criticalsection.cc
# Opt level: O0

bool __thiscall rtc::CriticalSection::TryEnter(CriticalSection *this)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  PlatformThreadRef PVar4;
  FatalMessage local_328;
  FatalMessageVoidify local_1ad [20];
  byte local_199;
  FatalMessage local_198;
  FatalMessageVoidify local_19;
  CriticalSection *local_18;
  CriticalSection *this_local;
  
  local_18 = this;
  iVar2 = pthread_mutex_trylock((pthread_mutex_t *)this);
  if (iVar2 == 0) {
    if (this->recursion_count_ == 0) {
      local_199 = 0;
      if (this->thread_ != 0) {
        FatalMessageVoidify::FatalMessageVoidify(&local_19);
        FatalMessage::FatalMessage
                  (&local_198,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
                   ,0x82);
        local_199 = 1;
        poVar3 = FatalMessage::stream(&local_198);
        poVar3 = std::operator<<(poVar3,"Check failed: !thread_");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"# ");
        FatalMessageVoidify::operator&(&local_19,poVar3);
      }
      if ((local_199 & 1) != 0) {
        FatalMessage::~FatalMessage(&local_198);
      }
      PVar4 = CurrentThreadRef();
      this->thread_ = PVar4;
    }
    else {
      bVar1 = CurrentThreadIsOwner(this);
      if (!bVar1) {
        FatalMessageVoidify::FatalMessageVoidify(local_1ad);
        FatalMessage::FatalMessage
                  (&local_328,
                   "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/base/criticalsection.cc"
                   ,0x85);
        poVar3 = FatalMessage::stream(&local_328);
        poVar3 = std::operator<<(poVar3,"Check failed: CurrentThreadIsOwner()");
        poVar3 = (ostream *)std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
        poVar3 = std::operator<<(poVar3,"# ");
        FatalMessageVoidify::operator&(local_1ad,poVar3);
        FatalMessage::~FatalMessage(&local_328);
      }
    }
    this->recursion_count_ = this->recursion_count_ + 1;
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

EXCLUSIVE_TRYLOCK_FUNCTION(true) {
#if defined(WEBRTC_WIN)
  return TryEnterCriticalSection(&crit_) != FALSE;
#else
#if defined(WEBRTC_MAC) && !USE_NATIVE_MUTEX_ON_MAC
  if (!IsThreadRefEqual(owning_thread_, CurrentThreadRef())) {
    if (AtomicOps::CompareAndSwap(&lock_queue_, 0, 1) != 0)
      return false;
    owning_thread_ = CurrentThreadRef();
    RTC_DCHECK(!recursion_);
  } else {
    AtomicOps::Increment(&lock_queue_);
  }
  ++recursion_;
#else
  if (pthread_mutex_trylock(&mutex_) != 0)
    return false;
#endif
#if CS_DEBUG_CHECKS
  if (!recursion_count_) {
    RTC_DCHECK(!thread_);
    thread_ = CurrentThreadRef();
  } else {
    RTC_DCHECK(CurrentThreadIsOwner());
  }
  ++recursion_count_;
#endif
  return true;
#endif
}